

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O2

void __thiscall flow::MatchHead::MatchHead(MatchHead *this,MatchDef *def,Program *program)

{
  pointer pMVar1;
  pointer pMVar2;
  
  Match::Match(&this->super_Match,def);
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__MatchHead_0019cc48;
  util::
  PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::Node::Node(&(this->map_).root_);
  pMVar1 = (def->cases).super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pMVar2 = (def->cases).
                super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar2 != pMVar1; pMVar2 = pMVar2 + 1) {
    util::
    PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::insert(&this->map_,
             (program->cp_).strings_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + pMVar2->label,&pMVar2->pc);
  }
  return;
}

Assistant:

MatchHead::MatchHead(const MatchDef& def, Program* program)
    : Match(def),
      map_() {
  for (const auto& one : def.cases) {
    map_.insert(program->constants().getString(one.label), one.pc);
  }
}